

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O1

void __thiscall
TestChain100Setup::TestChain100Setup(TestChain100Setup *this,ChainType chain_type,TestOpts opts)

{
  uint256 *puVar1;
  TestOpts opts_00;
  int iVar2;
  Chainstate *pCVar3;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RDX;
  long in_FS_OFFSET;
  array<unsigned_char,_32UL> vchKey;
  mutex_type *in_stack_ffffffffffffff48;
  bool in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff51;
  pointer in_stack_ffffffffffffff58;
  pointer in_stack_ffffffffffffff60;
  pointer local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  string local_68;
  uchar local_48 [40];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&stack0xffffffffffffff58,in_RDX)
  ;
  opts_00.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = in_stack_ffffffffffffff50;
  opts_00.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff48;
  opts_00.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = in_stack_ffffffffffffff51;
  opts_00.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffff58;
  opts_00._24_8_ = in_stack_ffffffffffffff60;
  TestingSetup::TestingSetup(&this->super_TestingSetup,REGTEST,opts_00);
  if (in_stack_ffffffffffffff58 != (pointer)0x0) {
    operator_delete(in_stack_ffffffffffffff58,(long)local_98 - (long)in_stack_ffffffffffffff58);
  }
  (this->coinbaseKey).keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (array<unsigned_char,_32UL> *)0x0;
  (this->m_coinbase_txns).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_coinbase_txns).
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_coinbase_txns).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->m_coinbase_txns).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  SetMockTime(0x5f4d1810);
  local_48[0x10] = '\0';
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  local_48[0x14] = '\0';
  local_48[0x15] = '\0';
  local_48[0x16] = '\0';
  local_48[0x17] = '\0';
  local_48[0x18] = '\0';
  local_48[0x19] = '\0';
  local_48[0x1a] = '\0';
  local_48[0x1b] = '\0';
  local_48[0x1c] = '\0';
  local_48[0x1d] = '\0';
  local_48[0x1e] = '\0';
  local_48[0x1f] = '\x01';
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  CKey::Set<unsigned_char_const*>(&this->coinbaseKey,local_48,local_48 + 0x20,true);
  mineBlocks(this,100);
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffff48);
  pCVar3 = ChainstateManager::ActiveChainstate
                     ((this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                      m_node.chainman._M_t.
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  puVar1 = (pCVar3->m_chain).vChain.
           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1]->phashBlock;
  if (puVar1 == (uint256 *)0x0) {
    __assert_fail("phashBlock != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                  ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
  }
  local_88 = *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
  uStack_80 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 8);
  local_78 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x10);
  uStack_70 = *(undefined8 *)((puVar1->super_base_blob<256U>).m_data._M_elems + 0x18);
  base_blob<256u>::ToString_abi_cxx11_(&local_68,&local_88);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_68,"571d80a9967ae599cec0448b0b0ba1cfb606f584d8069bd7166b86854ba7a191");
  if (iVar2 != 0) {
    __assert_fail("m_node.chainman->ActiveChain().Tip()->GetBlockHash().ToString() == \"571d80a9967ae599cec0448b0b0ba1cfb606f584d8069bd7166b86854ba7a191\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                  ,0x161,"TestChain100Setup::TestChain100Setup(const ChainType, TestOpts)");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&stack0xffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TestChain100Setup::TestChain100Setup(
    const ChainType chain_type,
    TestOpts opts)
    : TestingSetup{ChainType::REGTEST, opts}
{
    SetMockTime(1598887952);
    constexpr std::array<unsigned char, 32> vchKey = {
        {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 1}};
    coinbaseKey.Set(vchKey.begin(), vchKey.end(), true);

    // Generate a 100-block chain:
    this->mineBlocks(COINBASE_MATURITY);

    {
        LOCK(::cs_main);
        assert(
            m_node.chainman->ActiveChain().Tip()->GetBlockHash().ToString() ==
            "571d80a9967ae599cec0448b0b0ba1cfb606f584d8069bd7166b86854ba7a191");
    }
}